

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_cbor.hpp
# Opt level: O1

type __thiscall
jsoncons::cbor::
decode_cbor<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (cbor *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                last,cbor_decode_options *options)

{
  value_type_conflict *__val;
  system_error *this_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  undefined8 extraout_RDX_01;
  int __fd;
  ulong uVar1;
  pointer puVar2;
  type tVar3;
  error_code __ec;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  adaptor;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  reader;
  allocator<char> local_2f9;
  json_visitor local_2f8;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *local_2f0;
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2e8;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_2b0;
  error_code local_230;
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  local_220;
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *source;
  
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&local_2b0,(allocator_type *)&local_220,(temp_allocator_type *)&local_2e8);
  local_2f8._vptr_basic_json_visitor = (_func_int **)&PTR__basic_json_visitor_00b5d1e8;
  local_2e8.position_ = 0;
  local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f0 = &local_2b0;
  local_2e8.current_._M_current = first._M_current;
  local_2e8.end_._M_current = last._M_current;
  local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x4000);
  source = &local_2e8;
  puVar2 = local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start + 0x4000;
  local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar2;
  memset(local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_start,0,0x4000);
  local_2e8.buffer_length_ = 0;
  local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar2;
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::allocator<char>>
  ::
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
            ((basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::allocator<char>>
              *)&local_220,source,&local_2f8,options,&local_2f9);
  __fd = (int)source;
  __buf = extraout_RDX;
  if (local_2e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    uVar1 = (long)local_2e8.buffer_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)local_2e8.buffer_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    operator_delete(local_2e8.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,uVar1);
    __fd = (int)uVar1;
    __buf = extraout_RDX_00;
  }
  basic_cbor_reader<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
  ::read(&local_220,__fd,__buf,(size_t)options);
  if (local_2b0.is_valid_ != false) {
    json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::get_result((json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)this);
    local_220.adaptor_.super_basic_item_event_visitor<char>._vptr_basic_item_event_visitor =
         (_func_int **)&PTR__basic_item_event_visitor_to_json_visitor_00b58998;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.adaptor_.false_constant._M_dataplus._M_p !=
        &local_220.adaptor_.false_constant.field_2) {
      operator_delete(local_220.adaptor_.false_constant._M_dataplus._M_p,
                      local_220.adaptor_.false_constant.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.adaptor_.true_constant._M_dataplus._M_p !=
        &local_220.adaptor_.true_constant.field_2) {
      operator_delete(local_220.adaptor_.true_constant._M_dataplus._M_p,
                      local_220.adaptor_.true_constant.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.adaptor_.null_constant._M_dataplus._M_p !=
        &local_220.adaptor_.null_constant.field_2) {
      operator_delete(local_220.adaptor_.null_constant._M_dataplus._M_p,
                      local_220.adaptor_.null_constant.field_2._M_allocated_capacity + 1);
    }
    if (local_220.adaptor_.level_stack_.
        super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_220.adaptor_.level_stack_.
                      super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_220.adaptor_.level_stack_.
                            super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_220.adaptor_.level_stack_.
                            super__Vector_base<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.adaptor_.key_buffer_._M_dataplus._M_p !=
        &local_220.adaptor_.key_buffer_.field_2) {
      operator_delete(local_220.adaptor_.key_buffer_._M_dataplus._M_p,
                      local_220.adaptor_.key_buffer_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.adaptor_.key_._M_dataplus._M_p != &local_220.adaptor_.key_.field_2) {
      operator_delete(local_220.adaptor_.key_._M_dataplus._M_p,
                      local_220.adaptor_.key_.field_2._M_allocated_capacity + 1);
    }
    basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
    ::~basic_cbor_parser(&local_220.parser_);
    if (local_2b0.structure_stack_.
        super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.structure_stack_.
                      super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b0.structure_stack_.
                            super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b0.structure_stack_.
                            super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector(&local_2b0.item_stack_);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_2b0.name_._M_dataplus._M_p != &local_2b0.name_.field_2) {
      operator_delete(local_2b0.name_._M_dataplus._M_p,
                      local_2b0.name_.field_2._M_allocated_capacity * 4 + 4);
    }
    basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_2b0.result_)
    ;
    tVar3.field_0.int64_.val_ = extraout_RDX_01;
    tVar3.field_0._0_8_ = this;
    return (type)tVar3.field_0;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::conv_errc,void>(&local_230,conversion_failed);
  __ec._4_4_ = 0;
  __ec._M_value = local_230._M_value;
  *(undefined ***)(this_00 + 0x50) = &PTR__json_exception_00b58738;
  __ec._M_cat = local_230._M_cat;
  std::system_error::system_error(this_00,__ec);
  *(undefined8 *)this_00 = 0xb586d8;
  *(undefined8 *)(this_00 + 0x50) = 0xb58710;
  *(undefined8 *)(this_00 + 0x20) = 0;
  *(size_t *)(this_00 + 0x28) = local_220.parser_.source_.position_;
  *(system_error **)(this_00 + 0x30) = this_00 + 0x40;
  *(undefined8 *)(this_00 + 0x38) = 0;
  this_00[0x40] = (system_error)0x0;
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,T>::type 
    decode_cbor(InputIt first, InputIt last,
                const cbor_decode_options& options = cbor_decode_options())
    {
        jsoncons::json_decoder<T> decoder;
        auto adaptor = make_json_visitor_adaptor<json_visitor>(decoder);
        basic_cbor_reader<binary_iterator_source<InputIt>> reader(binary_iterator_source<InputIt>(first, last), adaptor, options);
        reader.read();
        if (!decoder.is_valid())
        {
            JSONCONS_THROW(ser_error(conv_errc::conversion_failed, reader.line(), reader.column()));
        }
        return decoder.get_result();
    }